

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGhostObject.cpp
# Opt level: O2

void __thiscall
cbtGhostObject::addOverlappingObjectInternal
          (cbtGhostObject *this,cbtBroadphaseProxy *otherProxy,cbtBroadphaseProxy *thisProxy)

{
  int iVar1;
  cbtCollisionObject *otherObject;
  cbtCollisionObject *local_18;
  
  local_18 = (cbtCollisionObject *)otherProxy->m_clientObject;
  iVar1 = cbtAlignedObjectArray<cbtCollisionObject_*>::findLinearSearch
                    (&this->m_overlappingObjects,&local_18);
  if (iVar1 == (this->m_overlappingObjects).m_size) {
    cbtAlignedObjectArray<cbtCollisionObject_*>::push_back(&this->m_overlappingObjects,&local_18);
  }
  return;
}

Assistant:

void cbtGhostObject::addOverlappingObjectInternal(cbtBroadphaseProxy* otherProxy, cbtBroadphaseProxy* thisProxy)
{
	cbtCollisionObject* otherObject = (cbtCollisionObject*)otherProxy->m_clientObject;
	cbtAssert(otherObject);
	///if this linearSearch becomes too slow (too many overlapping objects) we should add a more appropriate data structure
	int index = m_overlappingObjects.findLinearSearch(otherObject);
	if (index == m_overlappingObjects.size())
	{
		//not found
		m_overlappingObjects.push_back(otherObject);
	}
}